

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriesestimator.cxx
# Opt level: O0

Matrix * __thiscall
SeriesEstimator::getDistribution(Matrix *__return_storage_ptr__,SeriesEstimator *this)

{
  double dVar1;
  double dVar2;
  longdouble lVar3;
  int iVar4;
  longdouble lVar5;
  double dVar6;
  double dVar7;
  double local_a50;
  Matrix local_a28;
  Matrix local_928;
  Matrix local_828;
  Matrix local_728;
  Matrix local_628;
  Matrix local_528;
  Matrix local_428;
  Matrix local_328;
  Matrix local_228;
  int local_128;
  int local_124;
  int i;
  int j;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_25;
  int local_24;
  double dStack_20;
  int timeSize;
  double samples;
  SeriesEstimator *this_local;
  Matrix *a;
  
  dVar6 = (double)(this->super_Estimator).nSamples;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_a50 = (double)(this->super_Estimator).nSamples;
  }
  else {
    local_a50 = 1.0;
  }
  dStack_20 = local_a50;
  local_24 = this->estimatorPre + this->estimatorPost;
  local_25 = 0;
  samples = (double)this;
  this_local = (SeriesEstimator *)__return_storage_ptr__;
  Matrix::Matrix(__return_storage_ptr__,local_24,this->estimatorDistLength,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"conditional density",&local_49);
  Matrix::setName(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (this->seriesSource != (StochasticEventGenerator *)0x0) {
    Parametric::getName_abi_cxx11_(&local_100,(Parametric *)this->seriesSource);
    std::operator+(&local_e0,"density of ",&local_100);
    std::operator+(&local_c0,&local_e0," (");
    Parametric::getType_abi_cxx11_((string *)&i,(Parametric *)this->seriesSource);
    std::operator+(&local_a0,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::operator+(&local_80,&local_a0,")");
    Matrix::setName(__return_storage_ptr__,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  if (((this->super_Estimator).nEstimate & 2U) != 0) {
    for (local_124 = 0; local_124 < this->estimatorDistLength; local_124 = local_124 + 1) {
      for (local_128 = 0; local_128 < local_24; local_128 = local_128 + 1) {
        iVar4 = local_128 - this->estimatorPre;
        Matrix::operator[](&local_428,__return_storage_ptr__,local_128);
        Matrix::operator[](&local_328,&local_428,local_124);
        Matrix::operator[](&local_228,&local_328,0);
        Matrix::operator=(&local_228,(double)iVar4);
        Matrix::~Matrix(&local_228);
        Matrix::~Matrix(&local_328);
        Matrix::~Matrix(&local_428);
        dVar6 = ((this->super_Estimator).estimatorTime)->dt;
        dVar7 = (double)local_124;
        dVar1 = this->estimatorDistScale;
        dVar2 = this->estimatorDistOffset;
        Matrix::operator[](&local_728,__return_storage_ptr__,local_128);
        Matrix::operator[](&local_628,&local_728,local_124);
        Matrix::operator[](&local_528,&local_628,1);
        Matrix::operator=(&local_528,dVar6 * (dVar7 * dVar1 + dVar2));
        Matrix::~Matrix(&local_528);
        Matrix::~Matrix(&local_628);
        Matrix::~Matrix(&local_728);
        lVar3 = this->estimatorDist[local_128][local_124];
        lVar5 = (longdouble)dStack_20;
        Matrix::operator[](&local_a28,__return_storage_ptr__,local_128);
        Matrix::operator[](&local_928,&local_a28,local_124);
        Matrix::operator[](&local_828,&local_928,2);
        Matrix::operator=(&local_828,(double)(lVar3 / lVar5));
        Matrix::~Matrix(&local_828);
        Matrix::~Matrix(&local_928);
        Matrix::~Matrix(&local_a28);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix SeriesEstimator::getDistribution()
{
	double samples = (nSamples!=0.0)? double(nSamples): 1.0;
	
	int timeSize = estimatorPre+estimatorPost;
	Matrix a(timeSize, estimatorDistLength, 3);
	a.setName("conditional density");
	if (seriesSource)
		a.setName("density of " + seriesSource->getName() + " (" + seriesSource->getType() + ")" );
	
	if ( nEstimate & EST_DENS ) {
		for ( int j=0; j<estimatorDistLength; j++)
			for ( int i=0; i<timeSize; i++ ) {
				a[i][j][0] = i - estimatorPre;
				a[i][j][1] = estimatorTime->dt * ((double(j) * estimatorDistScale) + estimatorDistOffset);
				a[i][j][2] = estimatorDist[i][j] / samples;
			}
	}
	return a;
}